

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall TRootHandler_MNDX::LoadPackageNames(TRootHandler_MNDX *this)

{
  bool local_71;
  void *pvStack_70;
  bool bFindResult;
  char *szFileName;
  PMNDX_PACKAGE pPackage;
  int local_4c;
  undefined1 local_48 [4];
  int nError;
  TMndxSearch Search;
  TRootHandler_MNDX *this_local;
  
  Search.pStruct40 = (TStruct40 *)this;
  TMndxSearch::TMndxSearch((TMndxSearch *)local_48);
  TMndxSearch::SetSearchMask((TMndxSearch *)local_48,"",0);
  local_4c = CASC_ARRAY::Create<_MNDX_PACKAGE>(&this->Packages,0x40);
  this_local._4_4_ = local_4c;
  if (local_4c == 0) {
    while( true ) {
      local_71 = false;
      TMndxMarFile::DoSearch((this->MndxInfo).MarFiles[0],(TMndxSearch *)local_48,&local_71);
      if ((local_71 & 1U) == 0) break;
      pvStack_70 = malloc((size_t)(Search.szFoundPath + 1));
      if (pvStack_70 == (void *)0x0) {
        this_local._4_4_ = 0xc;
        goto LAB_00125217;
      }
      szFileName = (char *)CASC_ARRAY::Insert(&this->Packages,(void *)0x0,1);
      if (szFileName == (char *)0x0) {
        this_local._4_4_ = 0xc;
        goto LAB_00125217;
      }
      memcpy(pvStack_70,(void *)Search.cchSearchMask,(size_t)Search.szFoundPath);
      *(char *)((long)pvStack_70 + (long)Search.szFoundPath) = '\0';
      *(void **)szFileName = pvStack_70;
      *(char **)(szFileName + 8) = Search.szFoundPath;
      *(undefined4 *)(szFileName + 0x10) = (undefined4)Search.cchFoundPath;
    }
    this_local._4_4_ = 0;
  }
LAB_00125217:
  pPackage._0_4_ = 1;
  TMndxSearch::~TMndxSearch((TMndxSearch *)local_48);
  return this_local._4_4_;
}

Assistant:

int LoadPackageNames()
    {
        TMndxSearch Search;
        int nError;

        // Prepare the file name search in the top level directory
        Search.SetSearchMask("", 0);

#ifdef _DEBUG
//      Search.SetSearchMask("mods/heroes.stormmod/base.stormmaps/maps/heroes/builtin/startingexperience/practicemode01.stormmap/dede.stormdata", 113);
#endif
        // Allocate initial name list structure
        nError = Packages.Create<MNDX_PACKAGE>(0x40);
        if(nError != ERROR_SUCCESS)
            return nError;

        // Keep searching as long as we find something
        for(;;)
        {
            PMNDX_PACKAGE pPackage;
            char * szFileName;
            bool bFindResult = false;

            // Search the next file name
            MndxInfo.MarFiles[0]->DoSearch(&Search, &bFindResult);
            if(bFindResult == false)
                break;

            // Create file name
            szFileName = CASC_ALLOC(char, Search.cchFoundPath + 1);
            if(szFileName == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            // Insert the found name to the top level directory list
            pPackage = (PMNDX_PACKAGE)Packages.Insert(NULL, 1);
            if(pPackage == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            // Fill the file name
            memcpy(szFileName, Search.szFoundPath, Search.cchFoundPath);
            szFileName[Search.cchFoundPath] = 0;

            // Fill the package structure
            pPackage->szFileName = szFileName;
            pPackage->nLength = Search.cchFoundPath;
            pPackage->nIndex = Search.FileNameIndex;
        }

        // Give the packages to the caller
        return ERROR_SUCCESS;
    }